

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

int resolveUpvalue(Compiler *compiler,Token *name)

{
  int iVar1;
  Compiler *in_RSI;
  long *in_RDI;
  int upvalue;
  int local;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  _Bool isLocal;
  undefined1 in_stack_ffffffffffffffe7;
  uint8_t index;
  undefined4 local_4;
  
  if (*in_RDI == 0) {
    local_4 = -1;
  }
  else {
    iVar1 = resolveLocal(in_RSI,(Token *)CONCAT17(in_stack_ffffffffffffffe7,
                                                  CONCAT16(in_stack_ffffffffffffffe6,
                                                           CONCAT24(in_stack_ffffffffffffffe4,
                                                                    in_stack_ffffffffffffffe0))));
    isLocal = SUB41((uint)iVar1 >> 0x10,0);
    index = (uint8_t)((uint)iVar1 >> 0x18);
    if (iVar1 == -1) {
      iVar1 = resolveUpvalue(in_RSI,(Token *)CONCAT17(index,CONCAT16(isLocal,CONCAT24((short)iVar1,
                                                                                                                                                                            
                                                  in_stack_ffffffffffffffe0))));
      if (iVar1 == -1) {
        local_4 = -1;
      }
      else {
        local_4 = addUpvalue(in_RSI,index,isLocal);
      }
    }
    else {
      *(undefined1 *)(*in_RDI + (long)iVar1 * 0x20 + 0x34) = 1;
      local_4 = addUpvalue(in_RSI,index,isLocal);
    }
  }
  return local_4;
}

Assistant:

static int resolveUpvalue(Compiler* compiler, Token* name) {
    if (compiler->enclosing == NULL) return -1;

    //Check if variable is in current Scope
    int local = resolveLocal(compiler->enclosing, name);
    if (local != -1) {
        compiler->enclosing->locals[local].isCaptured = true;
        return addUpvalue(compiler, (uint8_t)local, true);
    }

    //Check if variable is in current scope upValue
    int upvalue = resolveUpvalue(compiler->enclosing, name);
    if (upvalue != -1) {
        return addUpvalue(compiler, (uint8_t)upvalue, false);
    }

    return -1;
}